

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

bigint<26> * __thiscall bigint<26>::mul<13,13>(bigint<26> *this,bigint<13> *x,bigint<13> *y)

{
  int local_34;
  uint local_30;
  int j;
  dbldigit carry;
  int i;
  bigint<13> *y_local;
  bigint<13> *x_local;
  bigint<26> *this_local;
  
  if ((x->len == 0) || (y->len == 0)) {
    this->len = 0;
  }
  else {
    memset(this->digits,0,(long)y->len << 1);
    for (j = 0; j < x->len; j = j + 1) {
      local_30 = 0;
      for (local_34 = 0; local_34 < y->len; local_34 = local_34 + 1) {
        local_30 = (uint)x->digits[j] * (uint)y->digits[local_34] + (uint)this->digits[j + local_34]
                   + local_30;
        this->digits[j + local_34] = (digit)local_30;
        local_30 = local_30 >> 0x10;
      }
      this->digits[j + y->len] = (digit)local_30;
    }
    this->len = x->len + y->len;
    shrink(this);
  }
  return this;
}

Assistant:

bigint &mul(const bigint<X_DIGITS> &x, const bigint<Y_DIGITS> &y)
    {
        if(!x.len || !y.len) { len = 0; return *this; }
        memset(digits, 0, y.len*sizeof(digit));
        loopi(x.len)
        {
            dbldigit carry = 0;
            loopj(y.len)
            {
                carry += (dbldigit)x.digits[i] * (dbldigit)y.digits[j] + (dbldigit)digits[i+j];
                digits[i+j] = (digit)carry;
                carry >>= BI_DIGIT_BITS;
            }
            digits[i+y.len] = carry;
        }
        len = x.len + y.len;
        shrink();
        return *this;
    }